

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O3

void ZXing::DivideWithRemainder(Magnitude *a,Magnitude *b,Magnitude *qq,Magnitude *rr)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  char cVar3;
  bool bVar4;
  Magnitude *pMVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  long lVar7;
  pointer puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  Magnitude *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar17;
  size_t j;
  long lVar18;
  bool bVar19;
  Magnitude subtractBuf;
  Magnitude tmp2;
  Magnitude tmp;
  allocator_type local_e1;
  Magnitude *local_e0;
  Magnitude *local_d8;
  Magnitude *local_d0;
  pointer local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  pointer local_90;
  Magnitude *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  pointer local_58;
  ulong local_50;
  Magnitude local_48;
  
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = qq;
  if (qq == b) {
    local_e0 = &local_48;
  }
  local_d0 = local_e0;
  if (qq == a) {
    local_d0 = &local_48;
  }
  this = rr;
  if (rr == b) {
    this = &local_a8;
  }
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar2 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar2 == puVar8) ||
     (uVar11 = (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start, uVar11 < (ulong)((long)puVar8 - (long)puVar2)
     )) {
    puVar2 = (qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (qq->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(rr,a);
  }
  else {
    if (this != a) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (this,((long)uVar11 >> 3) + 1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this,a);
    }
    local_d8 = &local_a8;
    if (rr != b) {
      local_d8 = rr;
    }
    local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __position._M_current =
         (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (this,__position,(unsigned_long *)&local_c0);
      puVar12 = (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = 0;
      puVar12 = __position._M_current + 1;
      (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar12;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_c0,
               (long)puVar12 -
               (long)(this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_e1);
    pMVar5 = local_d0;
    local_80 = rr;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (local_d0,(((long)(a->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(a->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3) -
                        ((long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3)) + 1);
    pvVar6 = local_80;
    local_88 = qq;
    if (qq == a) {
      local_e0 = &local_48;
    }
    local_90 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    local_c8 = (pMVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    lVar13 = (long)local_90 - (long)local_c8;
    if (lVar13 != 0) {
      local_50 = lVar13 >> 3;
      puVar2 = (b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = (long)(b->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
      local_68 = (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(a->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
      local_70 = -local_50;
      lVar9 = (long)(this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar13 + -8;
      lVar13 = lVar13 + -8 +
               (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_78 = this;
      pvVar17 = this;
      do {
        local_70 = local_70 + 1;
        local_c8[local_50 - 1] = 0;
        local_50 = local_50 - 1;
        local_58 = (pvVar17->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_60 = -local_70;
        lVar7 = 0x40;
        do {
          cVar3 = (char)lVar7;
          lVar7 = lVar7 + -1;
          lVar18 = 0;
          bVar19 = false;
          do {
            uVar11 = *(ulong *)(lVar9 + lVar18 * 8);
            if (lVar18 == 0 || lVar7 == 0) {
              uVar14 = 0;
            }
            else {
              uVar14 = puVar2[lVar18 + -1] >> (0x41U - cVar3 & 0x3f);
            }
            if (lVar16 == lVar18) {
              uVar10 = 0;
            }
            else {
              uVar10 = puVar2[lVar18] << ((byte)lVar7 & 0x3f);
            }
            uVar15 = uVar11 - (uVar10 | uVar14);
            uVar1 = uVar15 - 1;
            bVar4 = !bVar19;
            bVar19 = uVar11 <= uVar1;
            if (bVar4) {
              uVar1 = uVar15;
              bVar19 = uVar11 < (uVar10 | uVar14);
            }
            *(ulong *)(lVar13 + lVar18 * 8) = uVar1;
            lVar18 = lVar18 + 1;
          } while (lVar16 + 1 + (ulong)(lVar16 == -1) != lVar18);
          uVar11 = lVar18 + local_60;
          if ((bool)(uVar11 < local_68 & bVar19)) {
            do {
              bVar19 = local_58[uVar11] == 0;
              local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] = local_58[uVar11] - 1;
              uVar11 = uVar11 + 1;
              if (local_68 <= uVar11) break;
            } while (bVar19);
          }
          if (!bVar19) {
            local_c8[local_50] = local_c8[local_50] | 1L << ((byte)lVar7 & 0x3f);
            for (; local_50 < uVar11; uVar11 = uVar11 - 1) {
              local_58[uVar11 - 1] =
                   local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11 - 1];
            }
          }
        } while (lVar7 != 0);
        lVar9 = lVar9 + -8;
        lVar13 = lVar13 + -8;
        pvVar17 = local_78;
      } while (local_50 != 0);
    }
    if (local_90[-1] == 0) {
      (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_90 + -1;
    }
    puVar2 = (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    while ((puVar2 != puVar8 && (puVar8 = puVar8 + -1, *puVar8 == 0))) {
      (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
    }
    if (local_d0 != qq) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign();
    }
    if (this != pvVar6) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(pvVar6,this);
    }
    if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void DivideWithRemainder(const Magnitude& a, const Magnitude& b, Magnitude& qq, Magnitude& rr)
{
	/* Defending against aliased calls is more complex than usual because we
	* are writing to both r and q.
	*
	* It would be silly to try to write quotient and remainder to the
	* same variable.  Rule that out right away. */
	assert(&rr != &qq);

	Magnitude tmp, tmp2;
	Magnitude& q = &qq == &a || &qq == &b ? tmp : qq;
	Magnitude& r = &rr == &b ? tmp2 : rr;

	/*
	* Knuth's definition of mod (which this function uses) is somewhat
	* different from the C++ definition of % in case of division by 0.
	*
	* We let a / 0 == 0 (it doesn't matter much) and a % 0 == a, no
	* exceptions thrown.  This allows us to preserve both Knuth's demand
	* that a mod 0 == a and the useful property that
	* (a / b) * b + (a % b) == a.
	*/
	/*
	* If a.len < b.len, then a < b, and we can be sure that b doesn't go into
	* a at all.  The quotient is 0 and *this is already the remainder (so leave it alone).
	*/
	if (b.empty() || a.size() < b.size()) {
		qq.clear();
		rr = a;
		return;
	}

	// At this point we know a.len >= b.len > 0.  (Whew!)

	/*
	* Overall method:
	*
	* For each appropriate i and i2, decreasing:
	*    Subtract (b << (i blocks and i2 bits)) from *this, storing the
	*      result in subtractBuf.
	*    If the subtraction succeeds with a nonnegative result:
	*        Turn on bit i2 of block i of the quotient q.
	*        Copy subtractBuf back into *this.
	*    Otherwise bit i2 of block i remains off, and *this is unchanged.
	*
	* Eventually q will contain the entire quotient, and *this will
	* be left with the remainder.
	*
	* subtractBuf[x] corresponds to blk[x], not blk[x+i], since 2005.01.11.
	* But on a single iteration, we don't touch the i lowest blocks of blk
	* (and don't use those of subtractBuf) because these blocks are
	* unaffected by the subtraction: we are subtracting
	* (b << (i blocks and i2 bits)), which ends in at least `i' zero
	* blocks. */

	/*
	* Make sure we have an extra zero block just past the value.
	*
	* When we attempt a subtraction, we might shift `b' so
	* its first block begins a few bits left of the dividend,
	* and then we'll try to compare these extra bits with
	* a nonexistent block to the left of the dividend.  The
	* extra zero block ensures sensible behavior; we need
	* an extra block in `subtractBuf' for exactly the same reason.
	*/
	if (&r != &a) {
		r.reserve(a.size() + 1);
		r = a;
	}
	r.push_back(0);

	Magnitude subtractBuf(r.size());

	// Set preliminary length for quotient and make room
	q.resize(a.size() - b.size() + 1);

	// For each possible left-shift of b in blocks...
	size_t i = q.size();
	while (i > 0) {
		i--;
		// For each possible left-shift of b in bits...
		// (Remember, N is the number of bits in a Blk.)
		q[i] = 0;
		size_t i2 = NB_BITS;
		while (i2 > 0) {
			i2--;
			/*
			* Subtract b, shifted left i blocks and i2 bits, from *this,
			* and store the answer in subtractBuf.  In the for loop, `k == i + j'.
			*
			* Compare this to the middle section of `multiply'.  They
			* are in many ways analogous.  See especially the discussion
			* of `getShiftedBlock'.
			*/
			size_t k = i;
			bool borrowIn = false;
			for (size_t j = 0; j <= b.size(); ++j, ++k) {
				auto temp = r[k] - GetShiftedBlock(b, j, i2);
				bool borrowOut = (temp > r[k]);
				if (borrowIn) {
					borrowOut |= (temp == 0);
					temp--;
				}
				// Since 2005.01.11, indices of `subtractBuf' directly match those of `blk', so use `k'.
				subtractBuf[k] = temp;
				borrowIn = borrowOut;
			}
			// No more extra iteration to deal with `bHigh'.
			// Roll-over a borrow as necessary.
			for (; k < a.size() && borrowIn; k++) {
				borrowIn = (r[k] == 0);
				subtractBuf[k] = r[k] - 1;
			}
			/*
			* If the subtraction was performed successfully (!borrowIn),
			* set bit i2 in block i of the quotient.
			*
			* Then, copy the portion of subtractBuf filled by the subtraction
			* back to *this.  This portion starts with block i and ends--
			* where?  Not necessarily at block `i + b.len'!  Well, we
			* increased k every time we saved a block into subtractBuf, so
			* the region of subtractBuf we copy is just [i, k).
			*/
			if (!borrowIn) {
				q[i] |= (Block(1) << i2);
				while (k > i) {
					k--;
					r[k] = subtractBuf[k];
				}
			}
		}
	}
	// Zap possible leading zero in quotient
	if (q.back() == 0)
		q.pop_back();
	
	// Zap any/all leading zeros in remainder
	while (!r.empty() && r.back() == 0) {
		r.pop_back();
	}

	if (&qq != &q)
		qq = std::move(q);
	if (&rr != &r)
		rr = std::move(r);
}